

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O0

int LinearToGammaWeighted(uint8_t *src,uint8_t *a_ptr,uint32_t total_a,int step,int rgb_stride)

{
  uint base_value;
  int iVar1;
  int in_ECX;
  byte *in_RSI;
  uint8_t *in_RDI;
  int in_R8D;
  uint32_t sum;
  int in_stack_ffffffffffffffc0;
  
  base_value = (uint)*in_RSI;
  GammaToLinear(*in_RDI);
  GammaToLinear(in_RDI[in_ECX]);
  GammaToLinear(in_RDI[in_R8D]);
  GammaToLinear(in_RDI[in_R8D + in_ECX]);
  iVar1 = LinearToGamma(base_value,in_stack_ffffffffffffffc0);
  return iVar1;
}

Assistant:

static WEBP_INLINE int LinearToGammaWeighted(const uint8_t* src,
                                             const uint8_t* a_ptr,
                                             uint32_t total_a, int step,
                                             int rgb_stride) {
  const uint32_t sum =
      a_ptr[0] * GammaToLinear(src[0]) +
      a_ptr[step] * GammaToLinear(src[step]) +
      a_ptr[rgb_stride] * GammaToLinear(src[rgb_stride]) +
      a_ptr[rgb_stride + step] * GammaToLinear(src[rgb_stride + step]);
  assert(total_a > 0 && total_a <= 4 * 0xff);
#if defined(USE_INVERSE_ALPHA_TABLE)
  assert((uint64_t)sum * kInvAlpha[total_a] < ((uint64_t)1 << 32));
#endif
  return LinearToGamma(DIVIDE_BY_ALPHA(sum, total_a), 0);
}